

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O0

IByteReader * __thiscall
PDFParser::WrapWithDecryptionFilter
          (PDFParser *this,PDFStreamInput *inStream,IByteReader *inToWrapStream)

{
  bool bVar1;
  PDFParser *local_30;
  IByteReader *result;
  IByteReader *inToWrapStream_local;
  PDFStreamInput *inStream_local;
  PDFParser *this_local;
  
  bVar1 = IsEncrypted(this);
  this_local = (PDFParser *)inToWrapStream;
  if (((bVar1) && (bVar1 = IsEncryptionSupported(this), bVar1)) &&
     (local_30 = (PDFParser *)
                 DecryptionHelper::CreateDefaultDecryptionFilterForStream
                           (&this->mDecryptionHelper,inStream,inToWrapStream), this_local = local_30
     , local_30 == (PDFParser *)0x0)) {
    if (this->mParserExtender != (IPDFParserExtender *)0x0) {
      local_30 = (PDFParser *)
                 (**(code **)(*(long *)this->mParserExtender + 0x20))
                           (this->mParserExtender,inStream,inToWrapStream);
    }
    this_local = (PDFParser *)inToWrapStream;
    if (local_30 != (PDFParser *)0x0) {
      this_local = local_30;
    }
  }
  return (IByteReader *)this_local;
}

Assistant:

IByteReader* PDFParser::WrapWithDecryptionFilter(PDFStreamInput* inStream, IByteReader* inToWrapStream) {
	if (IsEncrypted() && IsEncryptionSupported()) {
		// try with decryption helper
		IByteReader*  result = 	mDecryptionHelper.CreateDefaultDecryptionFilterForStream(inStream, inToWrapStream);
		if (result)
			return result;

		// try with extender
		if(mParserExtender)
			result = mParserExtender->CreateDefaultDecryptionFilterForStream(inStream, inToWrapStream);

		if (result)
			return result;
		else
			return inToWrapStream;
	}
	else {
		return inToWrapStream;
	}
}